

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::CharSetInner::ToEquivClassW
          (CharSetInner *this,ArenaAllocator *allocator,uint level,uint base,uint *tblidx,
          CharSet<char16_t> *result)

{
  CharSetNode *pCVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  uint i;
  long lVar5;
  
  if (level == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x238,"(level > 0)","level > 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  lVar5 = 0;
  do {
    pCVar1 = this->children[lVar5];
    if (pCVar1 != (CharSetNode *)0x0) {
      (*pCVar1->_vptr_CharSetNode[7])(pCVar1,allocator,(ulong)(level - 1),(ulong)base,tblidx,result)
      ;
    }
    base = base + (1 << ((char)level * '\x04' + 4U & 0x1f));
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
  return;
}

Assistant:

void CharSetInner::ToEquivClassW(ArenaAllocator* allocator, uint level, uint base, uint& tblidx, CharSet<char16>& result) const
    {
        Assert(level > 0);
        level--;
        uint delta = lim(level) + 1;
        for (uint i = 0; i < branchingPerInnerLevel; i++)
        {
            if (children[i] != nullptr)
            {
                children[i]->ToEquivClassW(allocator, level, base, tblidx, result);
            }
            base += delta;
        }
    }